

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

bool __thiscall
Compressor::encodeHeaderlessChunk
          (Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *output,
          Image *input,Type type,bool isSwitch)

{
  uint8_t *puVar1;
  Image *image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  runtime_error *this_00;
  undefined7 in_register_00000081;
  bool bVar3;
  int p2;
  int p1;
  Image _local;
  
  Image::Image(&_local,(Size)0x0,(Color)0x0);
  image = input;
  if ((int)CONCAT71(in_register_00000081,isSwitch) == 0) {
    Image::operator=(&_local,input);
    swapBR(&_local);
    image = &_local;
  }
  if (type < TYPE_INDEXED_ALPHA) {
    prepareWriteRGB(&this->impl->scratch,image);
    puVar1 = (this->impl->scratch).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar3 = true;
    compress(this,output,puVar1,
             *(int *)&(this->impl->scratch).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (int)puVar1,isSwitch);
  }
  else if (type == TYPE_INDEXED_ALPHA) {
    Impl::getPalettes(this->impl,input,&p1,&p2);
    bVar3 = -1 < p2;
    if (bVar3) {
      pvVar2 = Impl::writePaletted(this->impl,image,&this->impl->palette2,true);
      puVar1 = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      compress(this,output,puVar1,
               *(int *)&(pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (int)puVar1,isSwitch);
    }
  }
  else {
    if (type != TYPE_INDEXED) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string((string *)&p2,(uint)type);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p1,
                     "Unexpected type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p2);
      std::runtime_error::runtime_error(this_00,(string *)&p1);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Impl::getPalettes(this->impl,input,&p1,&p2);
    bVar3 = -1 < p1;
    if (bVar3) {
      pvVar2 = Impl::writePaletted(this->impl,image,&this->impl->palette1,false);
      puVar1 = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      compress(this,output,puVar1,
               *(int *)&(pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (int)puVar1,isSwitch);
    }
  }
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&_local.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  return bVar3;
}

Assistant:

bool Compressor::encodeHeaderlessChunk(std::vector<uint8_t>& output, const Image& input, ChunkHeader::Type type, bool isSwitch) {
	Image _local;
	const Image& local = isSwitch ? input : _local;
	if (!isSwitch) {
		_local = input;
		swapBR(_local);
	}
	switch (type) {
		case ChunkHeader::TYPE_COLOR:
		case ChunkHeader::TYPE_COLOR1:
			prepareWriteRGB(impl->scratch, local);
			compress(output, impl->scratch.data(), impl->scratch.size(), isSwitch);
			return true;

		case ChunkHeader::TYPE_INDEXED: {
			int p1, p2;
			impl->getPalettes(input, p1, p2);
			if (p1 < 0) { return false; }
			auto& img = impl->writePaletted(local, impl->palette1, false);
			compress(output, img.data(), img.size(), isSwitch);
			return true;
		}

		case ChunkHeader::TYPE_INDEXED_ALPHA: {
			int p1, p2;
			impl->getPalettes(input, p1, p2);
			if (p2 < 0) { return false; }
			auto& img = impl->writePaletted(local, impl->palette2, true);
			compress(output, img.data(), img.size(), isSwitch);
			return true;
		}
	}
	throw std::runtime_error("Unexpected type " + std::to_string(type));
}